

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  Token *pTVar1;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> inheritedMacros;
  bool bVar2;
  reference pSVar3;
  reference ppDVar4;
  reference this_00;
  SyntaxPrinter *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  Token TVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  string_view text;
  format_args args;
  bool local_679;
  string local_638;
  v9 *local_618;
  char *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string_view local_5e8;
  basic_string_view<char,_std::char_traits<char>_> local_5d8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_5c8;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [8];
  SyntaxPrinter printer;
  DefineDirectiveSyntax *macro;
  iterator __end2;
  iterator __begin2;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  *__range2;
  Token token;
  undefined1 local_510 [16];
  reverse_iterator it;
  size_type sStack_4f8;
  Bag local_4e0;
  undefined1 local_4c0 [8];
  Preprocessor preprocessor;
  Diagnostics diagnostics;
  BumpAllocator alloc;
  Driver *this_local;
  undefined1 local_c0 [16];
  v9 *local_b0;
  char *local_a8;
  string *local_a0;
  v9 *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  char *local_80;
  v9 **local_78;
  Driver **local_70;
  undefined1 *local_68;
  Driver **local_60;
  Driver **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  char *local_40;
  v9 **local_38;
  v9 **local_30;
  v9 *local_28;
  char *pcStack_20;
  char *local_10;
  
  BumpAllocator::BumpAllocator
            ((BumpAllocator *)
             (diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x68));
  Diagnostics::Diagnostics
            ((Diagnostics *)
             &preprocessor.pragmaProtectHandlers.
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>_>
              .num_elements);
  createOptionBag(&local_4e0,this);
  nonstd::span_lite::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  ::span<true,_0>((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *
                  )&it);
  inheritedMacros.size_ = sStack_4f8;
  inheritedMacros.data_ = (pointer)it.current._M_current;
  parsing::Preprocessor::Preprocessor
            ((Preprocessor *)local_4c0,&this->sourceManager,
             (BumpAllocator *)
             (diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x68),
             (Diagnostics *)
             &preprocessor.pragmaProtectHandlers.
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>_>
              .num_elements,&local_4e0,inheritedMacros);
  Bag::~Bag(&local_4e0);
  std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rbegin
            ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)(local_510 + 8));
  while( true ) {
    std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rend
              ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)local_510);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                             *)(local_510 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                             *)local_510);
    if (!bVar2) break;
    pSVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                          *)(local_510 + 8));
    parsing::Preprocessor::pushSource((Preprocessor *)local_4c0,*pSVar3);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                  *)&token.info,(int)local_510 + 8);
  }
  do {
    TVar5 = parsing::Preprocessor::next((Preprocessor *)local_4c0);
    token._0_8_ = TVar5.info;
    __range2._0_2_ = TVar5.kind;
  } while ((TokenKind)__range2 != EndOfFile);
  parsing::Preprocessor::getDefinedMacros
            ((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)&__begin2,(Preprocessor *)local_4c0);
  __end2 = std::
           vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
           ::begin((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    *)&__begin2);
  macro = (DefineDirectiveSyntax *)
          std::
          vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
          ::end((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                 *)&__begin2);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
                                *)&macro);
    if (!bVar2) break;
    ppDVar4 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
              ::operator*(&__end2);
    printer._40_8_ = *ppDVar4;
    slang::syntax::SyntaxPrinter::SyntaxPrinter((SyntaxPrinter *)local_5a8);
    slang::syntax::SyntaxPrinter::setIncludeComments((SyntaxPrinter *)local_5a8,false);
    slang::syntax::SyntaxPrinter::setIncludeTrivia((SyntaxPrinter *)local_5a8,false);
    pTVar1 = (Token *)(printer._40_8_ + 0x20);
    local_5b8._0_2_ = pTVar1->kind;
    local_5b8._2_1_ = pTVar1->field_0x2;
    local_5b8._3_1_ = pTVar1->numFlags;
    local_5b8._4_4_ = pTVar1->rawLen;
    uStack_5b0 = *(undefined8 *)(printer._40_8_ + 0x28);
    slang::syntax::SyntaxPrinter::print((SyntaxPrinter *)local_5a8,*pTVar1);
    slang::syntax::SyntaxPrinter::setIncludeTrivia((SyntaxPrinter *)local_5a8,true);
    if (*(long *)(printer._40_8_ + 0x30) != 0) {
      slang::syntax::SyntaxPrinter::print
                ((SyntaxPrinter *)local_5a8,*(SyntaxNode **)(printer._40_8_ + 0x30));
    }
    bVar2 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::empty
                      ((span<slang::parsing::Token,_18446744073709551615UL> *)
                       (printer._40_8_ + 0x58));
    local_679 = false;
    if (!bVar2) {
      this_00 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)
                           (printer._40_8_ + 0x58),0);
      sVar6 = parsing::Token::trivia(this_00);
      local_5c8 = sVar6;
      local_679 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
                  empty(&local_5c8);
    }
    if (local_679 != false) {
      local_5d8 = sv(" ",1);
      slang::syntax::SyntaxPrinter::append((SyntaxPrinter *)local_5a8,local_5d8);
    }
    slang::syntax::SyntaxPrinter::print
              ((SyntaxPrinter *)local_5a8,(SyntaxNode *)(printer._40_8_ + 0x40));
    local_78 = &local_618;
    local_80 = "{}\n";
    local_40 = "{}\n";
    local_618 = (v9 *)0x6d8716;
    local_38 = local_78;
    local_610 = (char *)std::char_traits<char>::length("{}\n");
    local_10 = local_80;
    this_01 = (SyntaxPrinter *)local_5a8;
    slang::syntax::SyntaxPrinter::str_abi_cxx11_(&local_638,this_01);
    local_88 = &local_608;
    local_98 = local_618;
    pcStack_90 = local_610;
    local_a0 = &local_638;
    local_30 = &local_98;
    local_b0 = local_618;
    local_a8 = local_610;
    local_28 = local_b0;
    pcStack_20 = local_a8;
    this_local = (Driver *)
                 ::fmt::v9::
                 make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
                           ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_a0,(v9 *)this_01,local_88);
    local_68 = local_c0;
    local_70 = &this_local;
    local_50 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_a8;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_70;
    local_60 = local_70;
    local_58 = local_70;
    local_48 = local_68;
    ::fmt::v9::vformat_abi_cxx11_(&local_608,local_b0,fmt,args);
    text = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_608);
    local_5e8 = text;
    OS::print(text);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_638);
    slang::syntax::SyntaxPrinter::~SyntaxPrinter((SyntaxPrinter *)local_5a8);
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~vector((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             *)&__begin2);
  parsing::Preprocessor::~Preprocessor((Preprocessor *)local_4c0);
  Diagnostics::~Diagnostics
            ((Diagnostics *)
             &preprocessor.pragmaProtectHandlers.
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>_>
              .num_elements);
  BumpAllocator::~BumpAllocator
            ((BumpAllocator *)
             (diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x68));
  return;
}

Assistant:

void Driver::reportMacros() {
    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, createOptionBag());

    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}